

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkleblock.cpp
# Opt level: O0

void __thiscall
CPartialMerkleTree::CPartialMerkleTree
          (CPartialMerkleTree *this,vector<uint256,_std::allocator<uint256>_> *vTxid,
          vector<bool,_std::allocator<bool>_> *vMatch)

{
  long lVar1;
  size_type sVar2;
  vector<bool,_std::allocator<bool>_> *in_RDI;
  long in_FS_OFFSET;
  int nHeight;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffac;
  vector<uint256,_std::allocator<uint256>_> *in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sVar2 = std::vector<uint256,_std::allocator<uint256>_>::size
                    ((vector<uint256,_std::allocator<uint256>_> *)in_stack_ffffffffffffff98);
  *(int *)&(in_RDI->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p = (int)sVar2;
  std::vector<bool,_std::allocator<bool>_>::vector(in_stack_ffffffffffffff98);
  std::vector<uint256,_std::allocator<uint256>_>::vector
            ((vector<uint256,_std::allocator<uint256>_> *)in_stack_ffffffffffffff98);
  *(undefined1 *)
   &in_RDI[1].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = 0;
  std::vector<bool,_std::allocator<bool>_>::clear(in_stack_ffffffffffffff98);
  std::vector<uint256,_std::allocator<uint256>_>::clear
            ((vector<uint256,_std::allocator<uint256>_> *)in_stack_ffffffffffffff98);
  iVar3 = 0;
  while( true ) {
    in_stack_ffffffffffffffac =
         CalcTreeWidth((CPartialMerkleTree *)
                       CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                       in_stack_ffffffffffffffa4);
    if (in_stack_ffffffffffffffac < 2) break;
    iVar3 = iVar3 + 1;
  }
  TraverseAndBuild((CPartialMerkleTree *)CONCAT44(iVar3,in_stack_ffffffffffffffd8),
                   in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                   in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CPartialMerkleTree::CPartialMerkleTree(const std::vector<uint256> &vTxid, const std::vector<bool> &vMatch) : nTransactions(vTxid.size()), fBad(false) {
    // reset state
    vBits.clear();
    vHash.clear();

    // calculate height of tree
    int nHeight = 0;
    while (CalcTreeWidth(nHeight) > 1)
        nHeight++;

    // traverse the partial tree
    TraverseAndBuild(nHeight, 0, vTxid, vMatch);
}